

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O0

void zSetupSpace(void *work,int_t lwork,GlobalLU_t *Glu)

{
  GlobalLU_t *Glu_local;
  int_t lwork_local;
  void *work_local;
  
  if (lwork == 0) {
    Glu->MemModel = SYSTEM;
  }
  else if (0 < lwork) {
    Glu->MemModel = USER;
    (Glu->stack).used = 0;
    (Glu->stack).top1 = 0;
    (Glu->stack).top2 = lwork / 4 << 2;
    (Glu->stack).size = (Glu->stack).top2;
    (Glu->stack).array = work;
  }
  return;
}

Assistant:

void zSetupSpace(void *work, int_t lwork, GlobalLU_t *Glu)
{
    if ( lwork == 0 ) {
	Glu->MemModel = SYSTEM; /* malloc/free */
    } else if ( lwork > 0 ) {
	Glu->MemModel = USER;   /* user provided space */
	Glu->stack.used = 0;
	Glu->stack.top1 = 0;
	Glu->stack.top2 = (lwork/4)*4; /* must be word addressable */
	Glu->stack.size = Glu->stack.top2;
	Glu->stack.array = (void *) work;
    }
}